

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O3

void __thiscall ssl_session_st::ssl_session_st(ssl_session_st *this,SSL_X509_METHOD *method)

{
  time_t tVar1;
  CRYPTO_EX_DATA *in_RDX;
  
  this->ssl_version = 1;
  this->key_arg_length = 0;
  this->key_arg[0] = '\0';
  this->key_arg[1] = '\0';
  this->session_id[2] = '\0';
  *(undefined1 *)((long)&this->sid_ctx_length + 3) = 0;
  *(undefined1 *)&this->krb5_client_princ_len = 0;
  this->krb5_client_princ[0] = '\0';
  this->krb5_client_princ[1] = '\0';
  this->krb5_client_princ[2] = '\0';
  this->krb5_client_princ[3] = '\0';
  this->krb5_client_princ[4] = '\0';
  this->krb5_client_princ[5] = '\0';
  this->krb5_client_princ[6] = '\0';
  this->krb5_client_princ[7] = '\0';
  this->krb5_client_princ[8] = '\0';
  this->krb5_client_princ[9] = '\0';
  this->krb5_client_princ[10] = '\0';
  this->krb5_client_princ[0xb] = '\0';
  this->krb5_client_princ[0xc] = '\0';
  this->krb5_client_princ[0xd] = '\0';
  this->krb5_client_princ[0xe] = '\0';
  this->krb5_client_princ[0xf] = '\0';
  *(SSL_X509_METHOD **)(this->krb5_client_princ + 0x10) = method;
  this->krb5_client_princ[0x18] = '\0';
  this->krb5_client_princ[0x19] = '\0';
  this->krb5_client_princ[0x1a] = '\0';
  this->krb5_client_princ[0x1b] = '\0';
  this->krb5_client_princ[0x1c] = '\0';
  this->krb5_client_princ[0x1d] = '\0';
  this->krb5_client_princ[0x1e] = '\0';
  this->krb5_client_princ[0x1f] = '\0';
  this->krb5_client_princ[0x20] = '\0';
  this->krb5_client_princ[0x21] = '\0';
  this->krb5_client_princ[0x22] = '\0';
  this->krb5_client_princ[0x23] = '\0';
  this->krb5_client_princ[0x24] = '\0';
  this->krb5_client_princ[0x25] = '\0';
  this->krb5_client_princ[0x26] = '\0';
  this->krb5_client_princ[0x27] = '\0';
  this->krb5_client_princ[0x28] = '\0';
  this->krb5_client_princ[0x29] = '\0';
  this->krb5_client_princ[0x2a] = '\0';
  this->krb5_client_princ[0x2b] = '\0';
  this->krb5_client_princ[0x2c] = '\0';
  this->krb5_client_princ[0x2d] = '\0';
  this->krb5_client_princ[0x2e] = '\0';
  this->krb5_client_princ[0x2f] = '\0';
  this->krb5_client_princ[0x30] = 'A';
  this->krb5_client_princ[0x31] = '\0';
  this->krb5_client_princ[0x32] = '\0';
  this->krb5_client_princ[0x33] = '\0';
  this->krb5_client_princ[0x34] = '\0';
  this->krb5_client_princ[0x35] = '\0';
  this->krb5_client_princ[0x36] = '\0';
  this->krb5_client_princ[0x37] = '\0';
  this->krb5_client_princ[0x38] = ' ';
  this->krb5_client_princ[0x39] = '\x1c';
  this->krb5_client_princ[0x3a] = '\0';
  this->krb5_client_princ[0x3b] = '\0';
  this->krb5_client_princ[0x3c] = ' ';
  this->krb5_client_princ[0x3d] = '\x1c';
  this->krb5_client_princ[0x3e] = '\0';
  this->krb5_client_princ[0x3f] = '\0';
  this->krb5_client_princ[0xe8] = '\0';
  *(undefined8 *)&this->references = 0;
  this->timeout = 0;
  this->krb5_client_princ[0x40] = '\0';
  this->krb5_client_princ[0x41] = '\0';
  this->krb5_client_princ[0x42] = '\0';
  this->krb5_client_princ[0x43] = '\0';
  this->krb5_client_princ[0x44] = '\0';
  this->krb5_client_princ[0x45] = '\0';
  this->krb5_client_princ[0x46] = '\0';
  this->krb5_client_princ[0x47] = '\0';
  this->krb5_client_princ[0x48] = '\0';
  this->krb5_client_princ[0x49] = '\0';
  this->krb5_client_princ[0x4a] = '\0';
  this->krb5_client_princ[0x4b] = '\0';
  this->krb5_client_princ[0x4c] = '\0';
  this->krb5_client_princ[0x4d] = '\0';
  this->krb5_client_princ[0x4e] = '\0';
  this->krb5_client_princ[0x4f] = '\0';
  this->krb5_client_princ[0x58] = '\0';
  this->krb5_client_princ[0x59] = '\0';
  this->krb5_client_princ[0x5a] = '\0';
  this->krb5_client_princ[0x5b] = '\0';
  this->krb5_client_princ[0x5c] = '\0';
  this->krb5_client_princ[0x5d] = '\0';
  this->krb5_client_princ[0x5e] = '\0';
  this->krb5_client_princ[0x5f] = '\0';
  this->krb5_client_princ[0x60] = '\0';
  this->krb5_client_princ[0x61] = '\0';
  this->krb5_client_princ[0x62] = '\0';
  this->krb5_client_princ[99] = '\0';
  this->krb5_client_princ[100] = '\0';
  this->krb5_client_princ[0x65] = '\0';
  this->krb5_client_princ[0x66] = '\0';
  this->krb5_client_princ[0x67] = '\0';
  this->krb5_client_princ[0x68] = '\0';
  this->krb5_client_princ[0x69] = '\0';
  this->krb5_client_princ[0x6a] = '\0';
  this->krb5_client_princ[0x6b] = '\0';
  this->krb5_client_princ[0x6c] = '\0';
  this->krb5_client_princ[0x6d] = '\0';
  this->krb5_client_princ[0x6e] = '\0';
  this->krb5_client_princ[0x6f] = '\0';
  this->krb5_client_princ[0x70] = '\0';
  this->krb5_client_princ[0x71] = '\0';
  this->krb5_client_princ[0x72] = '\0';
  this->krb5_client_princ[0x73] = '\0';
  this->krb5_client_princ[0x74] = '\0';
  this->krb5_client_princ[0x75] = '\0';
  this->krb5_client_princ[0x76] = '\0';
  this->krb5_client_princ[0x77] = '\0';
  this->krb5_client_princ[0x78] = '\0';
  this->krb5_client_princ[0x79] = '\0';
  this->krb5_client_princ[0x7a] = '\0';
  this->krb5_client_princ[0x7b] = '\0';
  this->krb5_client_princ[0x7c] = '\0';
  this->krb5_client_princ[0x7d] = '\0';
  this->krb5_client_princ[0x7e] = '\0';
  this->krb5_client_princ[0x7f] = '\0';
  this->krb5_client_princ[0x80] = '\0';
  this->krb5_client_princ[0x81] = '\0';
  this->krb5_client_princ[0x82] = '\0';
  this->krb5_client_princ[0x83] = '\0';
  this->krb5_client_princ[0x84] = '\0';
  this->krb5_client_princ[0x85] = '\0';
  this->krb5_client_princ[0x86] = '\0';
  this->krb5_client_princ[0x87] = '\0';
  this->krb5_client_princ[0x88] = '\0';
  this->krb5_client_princ[0x89] = '\0';
  this->krb5_client_princ[0x8a] = '\0';
  this->krb5_client_princ[0x8b] = '\0';
  this->krb5_client_princ[0x8c] = '\0';
  this->krb5_client_princ[0x8d] = '\0';
  this->krb5_client_princ[0x8e] = '\0';
  this->krb5_client_princ[0x8f] = '\0';
  this->krb5_client_princ[0x90] = '\0';
  this->krb5_client_princ[0x91] = '\0';
  this->krb5_client_princ[0x92] = '\0';
  this->krb5_client_princ[0x93] = '\0';
  this->krb5_client_princ[0x94] = '\0';
  this->krb5_client_princ[0x95] = '\0';
  this->krb5_client_princ[0x96] = '\0';
  this->krb5_client_princ[0x97] = '\0';
  this->krb5_client_princ[0x98] = '\0';
  this->krb5_client_princ[0x99] = '\0';
  this->krb5_client_princ[0x9a] = '\0';
  this->krb5_client_princ[0x9b] = '\0';
  this->krb5_client_princ[0x9c] = '\0';
  this->krb5_client_princ[0x9d] = '\0';
  this->krb5_client_princ[0x9e] = '\0';
  this->krb5_client_princ[0x9f] = '\0';
  this->krb5_client_princ[0xa0] = '\0';
  this->krb5_client_princ[0xa1] = '\0';
  this->krb5_client_princ[0xa2] = '\0';
  this->krb5_client_princ[0xa3] = '\0';
  this->krb5_client_princ[0xa4] = '\0';
  this->krb5_client_princ[0xa5] = '\0';
  this->krb5_client_princ[0xa6] = '\0';
  this->krb5_client_princ[0xa7] = '\0';
  *(undefined8 *)((long)&this->sess_cert + 1) = 0;
  *(undefined8 *)((long)&this->peer + 1) = 0;
  *(undefined8 *)((long)&this->psk_identity + 4) = 0;
  *(undefined8 *)&this->field_0x1a4 = 0;
  *(undefined8 *)(this->krb5_client_princ + 0xfc) = 0;
  *(undefined8 *)((long)&this->psk_identity_hint + 4) = 0;
  this->krb5_client_princ[0xec] = '\0';
  this->krb5_client_princ[0xed] = '\0';
  this->krb5_client_princ[0xee] = '\0';
  this->krb5_client_princ[0xef] = '\0';
  this->krb5_client_princ[0xf0] = '\0';
  this->krb5_client_princ[0xf1] = '\0';
  this->krb5_client_princ[0xf2] = '\0';
  this->krb5_client_princ[0xf3] = '\0';
  this->krb5_client_princ[0xf4] = '\0';
  this->krb5_client_princ[0xf5] = '\0';
  this->krb5_client_princ[0xf6] = '\0';
  this->krb5_client_princ[0xf7] = '\0';
  this->krb5_client_princ[0xf8] = '\0';
  this->krb5_client_princ[0xf9] = '\0';
  this->krb5_client_princ[0xfa] = '\0';
  this->krb5_client_princ[0xfb] = '\0';
  CRYPTO_new_ex_data((int)this + 0xe0,method,in_RDX);
  tVar1 = time((time_t *)0x0);
  *(time_t *)(this->krb5_client_princ + 0x40) = tVar1;
  return;
}

Assistant:

ssl_session_st::ssl_session_st(const SSL_X509_METHOD *method)
    : RefCounted(CheckSubClass()),
      x509_method(method),
      extended_master_secret(false),
      peer_sha256_valid(false),
      not_resumable(false),
      ticket_age_add_valid(false),
      is_server(false),
      is_quic(false),
      has_application_settings(false),
      is_resumable_across_names(false) {
  CRYPTO_new_ex_data(&ex_data);
  time = ::time(nullptr);
}